

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts5ParseNodeFree(Fts5ExprNode *p)

{
  long lVar1;
  
  if (p != (Fts5ExprNode *)0x0) {
    if (0 < p->nChild) {
      lVar1 = 0;
      do {
        sqlite3Fts5ParseNodeFree(p->apChild[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->nChild);
    }
    sqlite3Fts5ParseNearsetFree(p->pNear);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void sqlite3Fts5ParseNodeFree(Fts5ExprNode *p){
  if( p ){
    int i;
    for(i=0; i<p->nChild; i++){
      sqlite3Fts5ParseNodeFree(p->apChild[i]);
    }
    sqlite3Fts5ParseNearsetFree(p->pNear);
    sqlite3_free(p);
  }
}